

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterSparseDim
          (SPxDevexPR<double> *this,double *best,double feastol)

{
  double *pdVar1;
  double *pdVar2;
  char *pcVar3;
  int *piVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar5;
  long extraout_RDX_01;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i;
  double x;
  int idx;
  int enterIdx;
  double *cpen;
  double *cTest;
  uint local_44;
  double in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int iVar6;
  DataKey local_8;
  
  SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2abd6f);
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2abd8c);
  iVar6 = -1;
  local_44 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8));
  lVar5 = extraout_RDX;
  while (local_44 = local_44 - 1, -1 < (int)local_44) {
    pcVar3 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_44,
                           (int)lVar5);
    in_stack_ffffffffffffffc8 = (int)pcVar3;
    in_stack_ffffffffffffffc0 = pdVar1[in_stack_ffffffffffffffc8];
    if (-in_XMM0_Qa <= in_stack_ffffffffffffffc0) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x7e8),(char *)(ulong)local_44);
      piVar4 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x868),
                          in_stack_ffffffffffffffc8);
      *piVar4 = 0;
      lVar5 = extraout_RDX_01;
    }
    else {
      in_stack_ffffffffffffffc0 =
           devexpr::computePrice<double>
                     (in_stack_ffffffffffffffc0,pdVar2[in_stack_ffffffffffffffc8],in_XMM0_Qa);
      lVar5 = extraout_RDX_00;
      if (*in_RSI <= in_stack_ffffffffffffffc0 && in_stack_ffffffffffffffc0 != *in_RSI) {
        *in_RSI = in_stack_ffffffffffffffc0;
        lVar5 = (long)in_stack_ffffffffffffffc8;
        *(double *)(in_RDI + 0x38) = pdVar2[lVar5];
        iVar6 = in_stack_ffffffffffffffc8;
      }
    }
  }
  if (iVar6 < 0) {
    SPxId::SPxId((SPxId *)0x2abefb);
  }
  else {
    local_8 = (DataKey)SPxSolverBase<double>::coId
                                 ((SPxSolverBase<double> *)CONCAT44(iVar6,in_stack_ffffffffffffffc8)
                                  ,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->coWeights.dim() == this->thesolver->coTest().dim());

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);

   return SPxId();
}